

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

TimingPathSymbol *
slang::ast::TimingPathSymbol::fromSyntax(Scope *parent,PathDeclarationSyntax *syntax)

{
  TokenKind TVar1;
  PathDescriptionSyntax *pPVar2;
  PathSuffixSyntax *pPVar3;
  Compilation *this;
  TimingPathSymbol *pTVar4;
  Polarity edgePolarity;
  Polarity polarity;
  EdgeKind edgeIdentifier;
  ConnectionKind connectionKind;
  Polarity local_38 [2];
  EdgeKind local_30;
  ConnectionKind local_2c;
  SourceLocation local_28;
  Token local_20;
  
  pPVar2 = (syntax->desc).ptr;
  TVar1 = (pPVar2->polarityOperator).kind;
  if (TVar1 < PlusEqual) {
    if (TVar1 == Plus) {
LAB_0022e796:
      local_38[1] = 1;
      goto LAB_0022e7b2;
    }
    if (TVar1 != Minus) {
LAB_0022e7aa:
      local_38[1] = 0;
      goto LAB_0022e7b2;
    }
  }
  else if (TVar1 != MinusEqual) {
    if (TVar1 != PlusEqual) goto LAB_0022e7aa;
    goto LAB_0022e796;
  }
  local_38[1] = 2;
LAB_0022e7b2:
  local_2c = (ConnectionKind)((pPVar2->pathOperator).kind != StarArrow);
  local_30 = SemanticFacts::getEdgeKind((pPVar2->edgeIdentifier).kind);
  local_38[0] = Unknown;
  pPVar3 = (((syntax->desc).ptr)->suffix).ptr;
  if ((pPVar3->super_SyntaxNode).kind == EdgeSensitivePathSuffix) {
    switch((short)pPVar3[4].super_SyntaxNode.kind) {
    case 0x1e:
    case 0x20:
      local_38[0] = Positive;
      break;
    case 0x23:
    case 0x25:
      local_38[0] = Negative;
    }
  }
  this = parent->compilation;
  local_20 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_28 = parsing::Token::location(&local_20);
  pTVar4 = BumpAllocator::
           emplace<slang::ast::TimingPathSymbol,slang::SourceLocation,slang::ast::TimingPathSymbol::ConnectionKind&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::EdgeKind&>
                     (&this->super_BumpAllocator,&local_28,&local_2c,local_38 + 1,local_38,&local_30
                     );
  (pTVar4->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pTVar4;
}

Assistant:

TimingPathSymbol& TimingPathSymbol::fromSyntax(const Scope& parent,
                                               const PathDeclarationSyntax& syntax) {
    Polarity polarity;
    switch (syntax.desc->polarityOperator.kind) {
        case TokenKind::Plus:
        case TokenKind::PlusEqual:
            polarity = Polarity::Positive;
            break;
        case TokenKind::Minus:
        case TokenKind::MinusEqual:
            polarity = Polarity::Negative;
            break;
        default:
            polarity = Polarity::Unknown;
            break;
    }

    auto connectionKind = syntax.desc->pathOperator.kind == TokenKind::StarArrow
                              ? ConnectionKind::Full
                              : ConnectionKind::Parallel;

    auto edgeIdentifier = SemanticFacts::getEdgeKind(syntax.desc->edgeIdentifier.kind);

    auto edgePolarity = Polarity::Unknown;
    if (syntax.desc->suffix->kind == SyntaxKind::EdgeSensitivePathSuffix) {
        auto& esps = syntax.desc->suffix->as<EdgeSensitivePathSuffixSyntax>();
        switch (esps.polarityOperator.kind) {
            case TokenKind::Plus:
            case TokenKind::PlusColon:
                edgePolarity = Polarity::Positive;
                break;
            case TokenKind::Minus:
            case TokenKind::MinusColon:
                edgePolarity = Polarity::Negative;
                break;
            default:
                break;
        }
    }

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<TimingPathSymbol>(syntax.getFirstToken().location(), connectionKind,
                                                 polarity, edgePolarity, edgeIdentifier);
    result->setSyntax(syntax);
    return *result;
}